

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Costs.cpp
# Opt level: O0

bool __thiscall
Costs::pruningTest(Costs *this,double r,double s,uint tau,uint t,uint n,double S,double Ap,double Am
                  ,double Gp,double Gm)

{
  double dVar1;
  double dVar2;
  double AmC;
  double tempGm;
  double state2;
  double ApC;
  double tempGp;
  double state1;
  bool response;
  double Gm_local;
  double Gp_local;
  double Am_local;
  double Ap_local;
  double S_local;
  uint n_local;
  uint t_local;
  uint tau_local;
  double s_local;
  double r_local;
  Costs *this_local;
  
  state1._7_1_ = false;
  if (((r == s) && (!NAN(r) && !NAN(s))) || (t == n)) {
    state1._7_1_ = true;
  }
  else if (s <= r) {
    dVar1 = (s + s + r) / 6.0;
    dVar2 = (double)tau * dVar1 + (s - r) / ((double)(t - tau) * -12.0) + S / (double)(t - tau) + Gm
    ;
    dVar1 = Am - dVar1;
    if ((dVar1 * (double)(t + 1) + dVar2 < 0.0) && (dVar1 * (double)n + dVar2 < 0.0)) {
      state1._7_1_ = true;
    }
  }
  else {
    dVar1 = (s + s + r) / 6.0;
    dVar2 = (double)tau * dVar1 + (s - r) / ((double)(t - tau) * -12.0) + S / (double)(t - tau) + Gp
    ;
    dVar1 = Ap - dVar1;
    if ((0.0 < dVar1 * (double)(t + 1) + dVar2) && (0.0 < dVar1 * (double)n + dVar2)) {
      state1._7_1_ = true;
    }
  }
  return state1._7_1_;
}

Assistant:

bool Costs::pruningTest(double r, double s, unsigned int tau, unsigned int t, unsigned int n, double S, double Ap, double Am, double Gp, double Gm)
{
  bool response = false;

  if(r == s || t == n){response = true;}
  else if(s > r)
  {
    double state1 = (r+2*s)/6.0;
    double tempGp = tau*state1 - (s-r)/(12.0*(t-tau)) + S/(1.0*(t-tau)) + Gp;
    double ApC = Ap - state1;
    if((ApC*(t+1) + tempGp > 0) && (ApC*n + tempGp > 0)){response = true;}
  }
  else /// s < r
  {
    double state2 = (r+2*s)/6.0;
    double tempGm = tau*state2 - (s-r)/(12.0*(t-tau)) + S/(1.0*(t-tau)) + Gm;
    double AmC = Am - state2;
    if((AmC*(t+1) + tempGm < 0) && (AmC*n + tempGm < 0)){response = true;}
  }

  //response = false; /// TO REMOVE
  return(response);
}